

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standalone_fuzz_target_runner.cc
# Opt level: O0

int main(int argc,char **argv)

{
  uchar *data;
  ostream *poVar1;
  size_t local_38;
  size_t size;
  shared_ptr<char> file_buf;
  int i;
  char **argv_local;
  int argc_local;
  
  for (file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
      file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ < argc;
      file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ + 1
      ) {
    std::shared_ptr<char>::shared_ptr((shared_ptr<char> *)&size);
    local_38 = 0;
    QUtil::read_file_into_memory
              (argv[file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                    _4_4_],(shared_ptr<char> *)&size,&local_38);
    data = (uchar *)std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&size);
    LLVMFuzzerTestOneInput(data,local_38);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             argv[file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi._4_4_]);
    poVar1 = std::operator<<(poVar1," successful");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)&size);
  }
  return 0;
}

Assistant:

int
main(int argc, char** argv)
{
    for (int i = 1; i < argc; i++) {
        std::shared_ptr<char> file_buf;
        size_t size = 0;
        QUtil::read_file_into_memory(argv[i], file_buf, size);
        LLVMFuzzerTestOneInput(reinterpret_cast<unsigned char*>(file_buf.get()), size);
        std::cout << argv[i] << " successful" << std::endl;
    }
    return 0;
}